

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_run_container_xor(array_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  container_t *pcVar4;
  array_container_t *paVar5;
  undefined8 *in_RDX;
  int *in_RDI;
  int retval;
  _Bool is_bitset;
  bitset_container_t *result;
  _Bool ret_is_bitset;
  array_container_t *temp;
  int card;
  uint8_t typecode_after;
  run_container_t *ans;
  int arbitrary_threshold;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  run_container_t *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  array_container_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  if (*in_RDI < 0x20) {
    run_container_create();
    bVar1 = (byte)((uint)in_stack_ffffffffffffffcc >> 0x18);
    array_run_container_lazy_xor
              (in_stack_ffffffffffffffc0,
               (run_container_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0);
    pcVar4 = convert_run_to_efficient_container_and_free
                       (in_stack_ffffffffffffffb0,
                        (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *in_RDX = pcVar4;
    local_4 = (uint)bVar1;
  }
  else {
    iVar3 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar3 < 0x1001) {
      paVar5 = array_container_from_run((run_container_t *)in_stack_ffffffffffffffc0);
      bVar1 = array_array_container_xor
                        ((array_container_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar3),paVar5,
                         (container_t **)
                         CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      array_container_free((array_container_t *)0x12cb26);
      local_4 = 2;
      if ((bVar1 & 1) != 0) {
        local_4 = 1;
      }
    }
    else {
      paVar5 = (array_container_t *)
               bitset_container_from_run((run_container_t *)in_stack_ffffffffffffffc0);
      _Var2 = bitset_array_container_ixor
                        ((bitset_container_t *)
                         CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),paVar5,
                         (container_t **)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_4 = 2;
      if (_Var2) {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int array_run_container_xor(const array_container_t *src_1,
                            const run_container_t *src_2, container_t **dst) {
    // semi following Java XOR implementation as of May 2016
    // the C OR implementation works quite differently and can return a run
    // container
    // TODO could optimize for full run containers.

    // use of lazy following Java impl.
    const int arbitrary_threshold = 32;
    if (src_1->cardinality < arbitrary_threshold) {
        run_container_t *ans = run_container_create();
        array_run_container_lazy_xor(src_1, src_2, ans);  // keeps runs.
        uint8_t typecode_after;
        *dst =
            convert_run_to_efficient_container_and_free(ans, &typecode_after);
        return typecode_after;
    }

    int card = run_container_cardinality(src_2);
    if (card <= DEFAULT_MAX_SIZE) {
        // Java implementation works with the array, xoring the run elements via
        // iterator
        array_container_t *temp = array_container_from_run(src_2);
        bool ret_is_bitset = array_array_container_xor(temp, src_1, dst);
        array_container_free(temp);
        return ret_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE;

    } else {  // guess that it will end up as a bitset
        bitset_container_t *result = bitset_container_from_run(src_2);
        bool is_bitset = bitset_array_container_ixor(result, src_1, dst);
        // any necessary type conversion has been done by the ixor
        int retval = (is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
        return retval;
    }
}